

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationDataBuilder::encodeExpansion32
          (CollationDataBuilder *this,int32_t *newCE32s,int32_t length,UErrorCode *errorCode)

{
  int *piVar1;
  int iVar2;
  int32_t *piVar3;
  ulong uVar4;
  uint uVar5;
  uint32_t uVar6;
  int32_t *piVar7;
  int32_t iVar8;
  ulong uVar9;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  iVar2 = (this->ce32s).count;
  piVar3 = (this->ce32s).elements;
  piVar7 = piVar3;
  for (uVar4 = 0; (long)uVar4 <= (long)iVar2 - (long)length; uVar4 = uVar4 + 1) {
    iVar8 = 0;
    if ((long)uVar4 < (long)iVar2) {
      iVar8 = piVar3[uVar4];
    }
    if (*newCE32s == iVar8) {
      uVar9 = 1;
      if (0x7ffff < uVar4) goto LAB_00232382;
      do {
        if ((uint)length == uVar9) {
          uVar5 = length << 8 | (int)uVar4 << 0xd;
          goto LAB_00232362;
        }
        iVar8 = 0;
        if ((int)uVar4 + (int)uVar9 < iVar2) {
          iVar8 = piVar7[uVar9];
        }
        piVar1 = newCE32s + uVar9;
        uVar9 = uVar9 + 1;
      } while (iVar8 == *piVar1);
    }
    piVar7 = piVar7 + 1;
  }
  if (iVar2 < 0x80000) {
    uVar4 = 0;
    uVar9 = 0;
    if (0 < length) {
      uVar9 = (ulong)(uint)length;
    }
    for (; uVar9 != uVar4; uVar4 = uVar4 + 1) {
      UVector32::addElement(&this->ce32s,newCE32s[uVar4],errorCode);
    }
    uVar5 = length << 8 | iVar2 << 0xd;
LAB_00232362:
    uVar6 = uVar5 | 0xc5;
  }
  else {
LAB_00232382:
    *errorCode = U_BUFFER_OVERFLOW_ERROR;
    uVar6 = 0;
  }
  return uVar6;
}

Assistant:

uint32_t
CollationDataBuilder::encodeExpansion32(const int32_t newCE32s[], int32_t length,
                                        UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    // See if this sequence of CE32s has already been stored.
    int32_t first = newCE32s[0];
    int32_t ce32sMax = ce32s.size() - length;
    for(int32_t i = 0; i <= ce32sMax; ++i) {
        if(first == ce32s.elementAti(i)) {
            if(i > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return 0;
            }
            for(int32_t j = 1;; ++j) {
                if(j == length) {
                    return Collation::makeCE32FromTagIndexAndLength(
                            Collation::EXPANSION32_TAG, i, length);
                }
                if(ce32s.elementAti(i + j) != newCE32s[j]) { break; }
            }
        }
    }
    // Store the new sequence.
    int32_t i = ce32s.size();
    if(i > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    for(int32_t j = 0; j < length; ++j) {
        ce32s.addElement(newCE32s[j], errorCode);
    }
    return Collation::makeCE32FromTagIndexAndLength(Collation::EXPANSION32_TAG, i, length);
}